

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlSetDeclaredEncoding(xmlParserCtxtPtr ctxt,xmlChar *encoding)

{
  int *piVar1;
  xmlChar *str2;
  xmlParserErrors xVar2;
  uint uVar3;
  int iVar4;
  xmlCharEncodingHandlerPtr in_RAX;
  char **ppcVar5;
  char *autoEnc;
  char *str2_00;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandlerPtr local_28;
  
  uVar3 = ctxt->input->flags;
  if (((uVar3 & 1) == 0) && ((ctxt->options & 0x200000) == 0)) {
    local_28 = in_RAX;
    xVar2 = xmlCreateCharEncodingHandler
                      ((char *)encoding,XML_ENC_INPUT,ctxt->convImpl,ctxt->convCtxt,&local_28);
    if (xVar2 == XML_ERR_OK) {
      xVar2 = xmlInputSetEncodingHandler(ctxt->input,local_28);
      if (xVar2 == XML_ERR_OK) {
        piVar1 = &ctxt->input->flags;
        *piVar1 = *piVar1 | 0x10;
        goto LAB_00142f95;
      }
      xmlCtxtErrIO(ctxt,xVar2,(char *)0x0);
    }
    else {
      xmlFatalErr(ctxt,xVar2,(char *)encoding);
    }
    (*xmlFree)(encoding);
  }
  else {
    uVar3 = uVar3 & 0xe;
    if (uVar3 == 2) {
      str2_00 = "UTF-8";
      ppcVar5 = xmlSetDeclaredEncoding::allowedUTF8;
    }
    else if (uVar3 == 6) {
      str2_00 = "UTF-16BE";
      ppcVar5 = xmlSetDeclaredEncoding::allowedUTF16BE;
    }
    else {
      if (uVar3 != 4) goto LAB_00142f95;
      str2_00 = "UTF-16LE";
      ppcVar5 = xmlSetDeclaredEncoding::allowedUTF16LE;
    }
    str2 = (xmlChar *)*ppcVar5;
    while (str2 != (xmlChar *)0x0) {
      ppcVar5 = ppcVar5 + 1;
      iVar4 = xmlStrcasecmp(encoding,str2);
      if (iVar4 == 0) goto LAB_00142f95;
      str2 = (xmlChar *)*ppcVar5;
    }
    xmlWarningMsg(ctxt,XML_WAR_ENCODING_MISMATCH,
                  "Encoding \'%s\' doesn\'t match auto-detected \'%s\'\n",encoding,
                  (xmlChar *)str2_00);
    (*xmlFree)(encoding);
    encoding = xmlStrdup((xmlChar *)str2_00);
    if (encoding == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
      encoding = (xmlChar *)0x0;
    }
LAB_00142f95:
    if (ctxt->encoding != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->encoding);
    }
    ctxt->encoding = encoding;
  }
  return;
}

Assistant:

void
xmlSetDeclaredEncoding(xmlParserCtxtPtr ctxt, xmlChar *encoding) {
    if (((ctxt->input->flags & XML_INPUT_HAS_ENCODING) == 0) &&
        ((ctxt->options & XML_PARSE_IGNORE_ENC) == 0)) {
        xmlCharEncodingHandlerPtr handler;
        xmlParserErrors res;

        /*
         * xmlSwitchEncodingName treats unsupported encodings as
         * warnings, but we want it to be an error in an encoding
         * declaration.
         */
        res = xmlCreateCharEncodingHandler((const char *) encoding,
                XML_ENC_INPUT, ctxt->convImpl, ctxt->convCtxt, &handler);
        if (res != XML_ERR_OK) {
            xmlFatalErr(ctxt, res, (const char *) encoding);
            xmlFree(encoding);
            return;
        }

        res  = xmlInputSetEncodingHandler(ctxt->input, handler);
        if (res != XML_ERR_OK) {
            xmlCtxtErrIO(ctxt, res, NULL);
            xmlFree(encoding);
            return;
        }

        ctxt->input->flags |= XML_INPUT_USES_ENC_DECL;
    } else if (ctxt->input->flags & XML_INPUT_AUTO_ENCODING) {
        static const char *allowedUTF8[] = {
            "UTF-8", "UTF8", NULL
        };
        static const char *allowedUTF16LE[] = {
            "UTF-16", "UTF-16LE", "UTF16", NULL
        };
        static const char *allowedUTF16BE[] = {
            "UTF-16", "UTF-16BE", "UTF16", NULL
        };
        const char **allowed = NULL;
        const char *autoEnc = NULL;

        switch (ctxt->input->flags & XML_INPUT_AUTO_ENCODING) {
            case XML_INPUT_AUTO_UTF8:
                allowed = allowedUTF8;
                autoEnc = "UTF-8";
                break;
            case XML_INPUT_AUTO_UTF16LE:
                allowed = allowedUTF16LE;
                autoEnc = "UTF-16LE";
                break;
            case XML_INPUT_AUTO_UTF16BE:
                allowed = allowedUTF16BE;
                autoEnc = "UTF-16BE";
                break;
        }

        if (allowed != NULL) {
            const char **p;
            int match = 0;

            for (p = allowed; *p != NULL; p++) {
                if (xmlStrcasecmp(encoding, BAD_CAST *p) == 0) {
                    match = 1;
                    break;
                }
            }

            if (match == 0) {
                xmlWarningMsg(ctxt, XML_WAR_ENCODING_MISMATCH,
                              "Encoding '%s' doesn't match "
                              "auto-detected '%s'\n",
                              encoding, BAD_CAST autoEnc);
                xmlFree(encoding);
                encoding = xmlStrdup(BAD_CAST autoEnc);
                if (encoding == NULL)
                    xmlCtxtErrMemory(ctxt);
            }
        }
    }

    if (ctxt->encoding != NULL)
        xmlFree((xmlChar *) ctxt->encoding);
    ctxt->encoding = encoding;
}